

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef*>
               (LevelRef **first,LevelRef **last,LevelRef **x)

{
  LevelRef *pLVar1;
  
  switch((uint)((int)last - (int)first) >> 3 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      pLVar1 = *x;
      *first = pLVar1;
      first = first + 1;
LAB_0011c025:
      *first = pLVar1;
      first = first + 1;
switchD_0011c000_caseD_6:
      pLVar1 = *x;
      *first = pLVar1;
      first = first + 1;
LAB_0011c036:
      *first = pLVar1;
      first = first + 1;
switchD_0011c000_caseD_4:
      pLVar1 = *x;
      *first = pLVar1;
      first = first + 1;
LAB_0011c047:
      *first = pLVar1;
      first = first + 1;
switchD_0011c000_caseD_2:
      pLVar1 = *x;
      *first = pLVar1;
      first = first + 1;
LAB_0011c058:
      *first = pLVar1;
    }
    break;
  case 1:
    pLVar1 = *x;
    goto LAB_0011c058;
  case 2:
    goto switchD_0011c000_caseD_2;
  case 3:
    pLVar1 = *x;
    goto LAB_0011c047;
  case 4:
    goto switchD_0011c000_caseD_4;
  case 5:
    pLVar1 = *x;
    goto LAB_0011c036;
  case 6:
    goto switchD_0011c000_caseD_6;
  case 7:
    pLVar1 = *x;
    goto LAB_0011c025;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}